

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

InsertionOrderIndex * __thiscall
kj::InsertionOrderIndex::operator=(InsertionOrderIndex *this,InsertionOrderIndex *other)

{
  bool bVar1;
  Fault local_60;
  Fault f;
  InsertionOrderIndex *local_50;
  InsertionOrderIndex *local_48;
  undefined1 local_40 [8];
  DebugComparison<kj::InsertionOrderIndex_*,_kj::InsertionOrderIndex_*> _kjCondition;
  InsertionOrderIndex *other_local;
  InsertionOrderIndex *this_local;
  
  local_50 = other;
  _kjCondition._32_8_ = other;
  local_48 = (InsertionOrderIndex *)
             _::DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_50)
  ;
  f.exception = (Exception *)this;
  _::DebugExpression<kj::InsertionOrderIndex*>::operator!=
            ((DebugComparison<kj::InsertionOrderIndex_*,_kj::InsertionOrderIndex_*> *)local_40,
             (DebugExpression<kj::InsertionOrderIndex*> *)&local_48,(InsertionOrderIndex **)&f);
  bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::InsertionOrderIndex*,kj::InsertionOrderIndex*>&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x318,FAILED,"&other != this","_kjCondition,",
               (DebugComparison<kj::InsertionOrderIndex_*,_kj::InsertionOrderIndex_*> *)local_40);
    _::Debug::Fault::fatal(&local_60);
  }
  this->capacity = *(uint *)_kjCondition._32_8_;
  this->links = *(Link **)(_kjCondition._32_8_ + 8);
  *(undefined4 *)_kjCondition._32_8_ = 0;
  *(undefined8 **)(_kjCondition._32_8_ + 8) = &EMPTY_LINK;
  return this;
}

Assistant:

InsertionOrderIndex& InsertionOrderIndex::operator=(InsertionOrderIndex&& other) {
  KJ_DASSERT(&other != this);
  capacity = other.capacity;
  links = other.links;
  other.capacity = 0;
  other.links = const_cast<Link*>(&EMPTY_LINK);
  return *this;
}